

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSubmitCommand.cxx
# Opt level: O3

void __thiscall cmCTestSubmitCommand::cmCTestSubmitCommand(cmCTestSubmitCommand *this)

{
  _Rb_tree_header *p_Var1;
  
  cmCTestHandlerCommand::cmCTestHandlerCommand(&this->super_cmCTestHandlerCommand);
  (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand._vptr_cmCommand =
       (_func_int **)&PTR__cmCTestSubmitCommand_0070d248;
  p_Var1 = &(this->Parts)._M_t._M_impl.super__Rb_tree_header;
  (this->Parts)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Parts)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Parts)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->Parts)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->Parts)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->Files)._M_t._M_impl.super__Rb_tree_header;
  (this->Files)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Files)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Files)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->Files)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->Files)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->RetryCount)._M_dataplus._M_p = (pointer)&(this->RetryCount).field_2;
  (this->RetryCount)._M_string_length = 0;
  (this->RetryCount).field_2._M_local_buf[0] = '\0';
  (this->RetryDelay)._M_dataplus._M_p = (pointer)&(this->RetryDelay).field_2;
  (this->RetryDelay)._M_string_length = 0;
  (this->RetryDelay).field_2._M_local_buf[0] = '\0';
  (this->CDashUploadFile)._M_dataplus._M_p = (pointer)&(this->CDashUploadFile).field_2;
  (this->CDashUploadFile)._M_string_length = 0;
  (this->CDashUploadFile).field_2._M_local_buf[0] = '\0';
  (this->CDashUploadType)._M_dataplus._M_p = (pointer)&(this->CDashUploadType).field_2;
  (this->CDashUploadType)._M_string_length = 0;
  (this->CDashUploadType).field_2._M_local_buf[0] = '\0';
  (this->HttpHeaders).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->HttpHeaders).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->HttpHeaders).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->SubmitURL)._M_dataplus._M_p = (pointer)&(this->SubmitURL).field_2;
  (this->SubmitURL)._M_string_length = 0;
  (this->SubmitURL).field_2._M_local_buf[0] = '\0';
  this->PartsMentioned = false;
  this->FilesMentioned = false;
  this->InternalTest = false;
  std::__cxx11::string::_M_replace((ulong)&this->RetryCount,0,(char *)0x0,0x5dabfe);
  std::__cxx11::string::_M_replace
            ((ulong)&this->RetryDelay,0,(char *)(this->RetryDelay)._M_string_length,0x5dabfe);
  this->CDashUpload = false;
  (this->super_cmCTestHandlerCommand).Arguments.
  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.super__Vector_impl_data.
  _M_start[6] = "BUILD_ID";
  (this->super_cmCTestHandlerCommand).Last = 7;
  return;
}

Assistant:

cmCTestSubmitCommand::cmCTestSubmitCommand()
{
  this->PartsMentioned = false;
  this->FilesMentioned = false;
  this->InternalTest = false;
  this->RetryCount = "";
  this->RetryDelay = "";
  this->CDashUpload = false;
  this->Arguments[cts_BUILD_ID] = "BUILD_ID";
  this->Last = cts_LAST;
}